

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

exr_result_t
exr_encoding_initialize
          (exr_const_context_t ctxt,int part_index,exr_chunk_info_t *cinfo,
          exr_encode_pipeline_t *encode)

{
  _internal_exr_part *part;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  int32_t iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t iVar9;
  uint8_t uVar10;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar13;
  exr_result_t eVar14;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar15;
  
  if (ctxt == (exr_const_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (cinfo == (exr_chunk_info_t *)0x0 || encode == (exr_encode_pipeline_t *)0x0) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
      uVar15 = 3;
    }
    else {
      if (*ctxt == (_priv_exr_context_t)0x3) {
        part = *(_internal_exr_part **)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8);
        memset(encode,0,0x1f8);
        eVar14 = internal_coding_fill_channel_info
                           (&encode->channels,&encode->channel_count,encode->_quick_chan_store,cinfo
                            ,(_internal_exr_context *)ctxt,part);
        if (eVar14 != 0) {
          return eVar14;
        }
        encode->part_index = part_index;
        encode->context = ctxt;
        iVar6 = cinfo->start_x;
        iVar7 = cinfo->start_y;
        iVar8 = cinfo->height;
        iVar9 = cinfo->width;
        uVar10 = cinfo->level_x;
        uVar11 = cinfo->level_y;
        uVar12 = cinfo->type;
        uVar13 = cinfo->compression;
        uVar1 = cinfo->data_offset;
        uVar2 = cinfo->packed_size;
        uVar3 = cinfo->unpacked_size;
        uVar4 = cinfo->sample_count_data_offset;
        uVar5 = cinfo->sample_count_table_size;
        (encode->chunk).idx = cinfo->idx;
        (encode->chunk).start_x = iVar6;
        (encode->chunk).start_y = iVar7;
        (encode->chunk).height = iVar8;
        (encode->chunk).width = iVar9;
        (encode->chunk).level_x = uVar10;
        (encode->chunk).level_y = uVar11;
        (encode->chunk).type = uVar12;
        (encode->chunk).compression = uVar13;
        (encode->chunk).data_offset = uVar1;
        (encode->chunk).packed_size = uVar2;
        (encode->chunk).unpacked_size = uVar3;
        (encode->chunk).sample_count_data_offset = uVar4;
        (encode->chunk).sample_count_table_size = uVar5;
        return 0;
      }
      if (*ctxt == (_priv_exr_context_t)0x1) {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
        uVar15 = 9;
      }
      else {
        UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
        uVar15 = 8;
      }
    }
    eVar14 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar15);
    return eVar14;
  }
  eVar14 = (**(code **)(ctxt + 0x48))
                     (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                      *(code **)(ctxt + 0x48));
  return eVar14;
}

Assistant:

exr_result_t
exr_encoding_initialize (
    exr_const_context_t     ctxt,
    int                     part_index,
    const exr_chunk_info_t* cinfo,
    exr_encode_pipeline_t*  encode)
{
    exr_result_t          rv;
    exr_encode_pipeline_t nil = {0};

    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);
    if (!cinfo || !encode)
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_INVALID_ARGUMENT));

    if (pctxt->mode != EXR_CONTEXT_WRITING_DATA)
    {
        if (pctxt->mode == EXR_CONTEXT_WRITE)
            return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
                pctxt->standard_error (pctxt, EXR_ERR_HEADER_NOT_WRITTEN));
        return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));
    }

    *encode = nil;

    rv = internal_coding_fill_channel_info (
        &(encode->channels),
        &(encode->channel_count),
        encode->_quick_chan_store,
        cinfo,
        pctxt,
        part);

    if (rv == EXR_ERR_SUCCESS)
    {
        encode->part_index = part_index;
        encode->context    = ctxt;
        encode->chunk      = *cinfo;
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}